

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_write_tile_obu_mt
               (AV1_COMP *cpi,uint8_t *dst,uint32_t *total_size,aom_write_bit_buffer *saved_wb,
               uint8_t obu_extn_header,FrameHeaderInfo *fh_info,int *largest_tile_id,
               uint *max_tile_size,uint32_t *obu_header_size,uint8_t **tile_data_start,
               int num_workers)

{
  ThreadData_conflict *__src;
  PackBSTileOrder *__s;
  TileDataEnc *pTVar1;
  AVxWorker *pAVar2;
  long lVar3;
  ulong uVar4;
  uint16_t *puVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  uint8_t *puVar11;
  EncWorkerData *pEVar12;
  int iVar13;
  ThreadData_conflict *td;
  uint uVar14;
  uint8_t *puVar15;
  uint uVar16;
  uint uVar17;
  uint32_t *__s_00;
  PackBSParams *pack_bs_params_00;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  uint local_d08c;
  uint8_t *local_d088;
  uint8_t *local_d080;
  ulong local_d078;
  ulong local_d070;
  uint *local_d068;
  ulong local_d060;
  ulong local_d058;
  FrameHeaderInfo *local_d050;
  long local_d048;
  MACROBLOCKD *local_d040;
  int tg_size_mi [512];
  size_t local_c838 [512];
  uint32_t tile_size [512];
  PackBSParams pack_bs_params [512];
  
  __s_00 = tile_size;
  local_d080 = dst;
  local_d068 = total_size;
  local_d050 = fh_info;
  memset(__s_00,0,0x800);
  for (lVar3 = 6; lVar3 != 0x2c06; lVar3 = lVar3 + 0x16) {
    *(uint32_t **)((long)&pack_bs_params[0].saved_wb + lVar3 * 4) = __s_00;
    __s_00 = __s_00 + 1;
  }
  uVar10 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  iVar18 = cpi->num_tg;
  local_d088 = (uint8_t *)CONCAT44(local_d088._4_4_,(int)((uVar10 - 1) + iVar18) / iVar18);
  memset(tg_size_mi,0,0x800);
  local_d060 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    local_d060 = 0;
  }
  piVar6 = &pack_bs_params[0].new_tg;
  iVar13 = 0;
  uVar14 = 0;
  uVar16 = 1;
  for (lVar3 = 0; local_d060 * 0x5d10 - lVar3 != 0; lVar3 = lVar3 + 0x5d10) {
    pTVar1 = cpi->tile_data;
    iVar7 = (*(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x32 + lVar3) -
            *(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x2e + lVar3)) *
            (*(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x3a + lVar3) -
            *(int *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x36 + lVar3));
    iVar13 = iVar13 + 1;
    bVar23 = (ulong)(uVar10 - 1) * 0x5d10 - lVar3 == 0;
    bVar9 = bVar23 || iVar13 == (int)local_d088;
    *(uint8_t *)(piVar6 + -7) = obu_extn_header;
    ((PackBSParams *)(piVar6 + -0x15))->saved_wb = saved_wb;
    *(undefined8 *)(piVar6 + -6) = 0;
    uVar17 = (uint)bVar9;
    piVar6[-1] = uVar17;
    *piVar6 = uVar16;
    *(undefined8 *)(piVar6 + -3) =
         *(undefined8 *)((long)((pTVar1->tctx).txb_skip_cdf + -1) + 0x3e + lVar3);
    tg_size_mi[uVar14] = tg_size_mi[uVar14] + iVar7;
    piVar6[-4] = iVar7;
    if (bVar23 || iVar13 == (int)local_d088) {
      iVar13 = 0;
    }
    uVar14 = uVar14 + uVar17;
    piVar6 = piVar6 + 0x16;
    uVar16 = (uint)bVar9;
  }
  local_d040 = &(cpi->td).mb.e_mbd;
  memset(local_c838,0,0x1000);
  iVar13 = 0;
  local_d070 = cpi->available_bs_size;
  local_d058 = (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows;
  local_d048 = (long)(int)local_d088 * 0x58;
  pack_bs_params_00 = pack_bs_params;
  puVar11 = local_d080;
  uVar20 = local_d070;
  for (uVar8 = 0; (long)uVar8 < (long)iVar18; uVar8 = uVar8 + 1) {
    if (uVar8 == iVar18 - 1) {
      local_d078 = 0;
      uVar4 = uVar20;
    }
    else {
      uVar4 = ((long)tg_size_mi[uVar8] * local_d070) / local_d058;
      local_d078 = uVar20 - uVar4;
    }
    pack_bs_params_00->dst = puVar11;
    pack_bs_params_00->tile_data_curr = puVar11;
    av1_write_obu_tg_tile_headers(cpi,local_d040,pack_bs_params_00,iVar13);
    puVar11 = puVar11 + uVar4;
    local_c838[uVar8] = uVar4 - (long)pack_bs_params_00->curr_tg_hdr_size;
    iVar18 = cpi->num_tg;
    iVar13 = iVar13 + (int)local_d088;
    pack_bs_params_00 = (PackBSParams *)((long)&pack_bs_params_00->saved_wb + local_d048);
    uVar20 = local_d078;
  }
  uVar4 = 0;
  uVar8 = local_d070;
  puVar15 = local_d080;
  for (lVar3 = 0; local_d060 * 0x58 - lVar3 != 0; lVar3 = lVar3 + 0x58) {
    iVar18 = *(int *)((long)&pack_bs_params[0].new_tg + lVar3);
    uVar19 = uVar20;
    if (iVar18 != 0) {
      uVar8 = local_c838[uVar4];
      uVar19 = uVar8;
    }
    iVar13 = *(int *)((long)&pack_bs_params[0].is_last_tile_in_tg + lVar3);
    if (iVar13 == 0) {
      uVar21 = ((long)*(int *)((long)&pack_bs_params[0].tile_size_mi + lVar3) * uVar8) /
               (ulong)(long)tg_size_mi[uVar4];
      uVar20 = uVar19 - uVar21;
    }
    else {
      uVar20 = 0;
      uVar21 = uVar19;
    }
    *(ulong *)((long)&pack_bs_params[0].tile_buf_size + lVar3) = uVar21;
    if (iVar18 == 0) {
      *(uint8_t **)((long)&pack_bs_params[0].dst + lVar3) = puVar11;
      *(uint8_t **)((long)&pack_bs_params[0].tile_data_curr + lVar3) = puVar15;
    }
    else {
      puVar11 = *(uint8_t **)((long)&pack_bs_params[0].dst + lVar3);
      puVar15 = *(uint8_t **)((long)&pack_bs_params[0].tile_data_curr + lVar3);
      uVar21 = uVar21 + (long)*(int *)((long)&pack_bs_params[0].curr_tg_hdr_size + lVar3);
      *(ulong *)((long)&pack_bs_params[0].tile_buf_size + lVar3) = uVar21;
    }
    uVar4 = (ulong)(((int)uVar4 + 1) - (uint)(iVar13 == 0));
    puVar11 = puVar11 + uVar21;
  }
  __src = &cpi->td;
  uVar10 = num_workers;
  while (0 < (int)uVar10) {
    uVar16 = uVar10 - 1;
    pAVar2 = (cpi->mt_info).workers;
    pEVar12 = (cpi->mt_info).tile_thr_data + uVar16;
    if (uVar10 == 1) {
      pEVar12->td = __src;
      td = __src;
    }
    else {
      td = pEVar12->original_td;
      pEVar12->td = td;
      if (td != __src) {
        memcpy(td,__src,0x256b0);
        td = pEVar12->td;
      }
    }
    pEVar12->cpi = cpi;
    pEVar12->start = uVar16;
    pEVar12->thread_id = uVar16;
    av1_reset_pack_bs_thread_data(td);
    pAVar2[uVar16].hook = pack_bs_worker_hook;
    pAVar2[uVar16].data1 = pEVar12;
    pAVar2[uVar16].data2 = pack_bs_params;
    uVar10 = uVar16;
  }
  iVar18 = (cpi->common).tiles.cols;
  iVar13 = (cpi->common).tiles.rows;
  (cpi->mt_info).pack_bs_sync.next_job_idx = 0;
  (cpi->mt_info).pack_bs_sync.pack_bs_mt_exit = false;
  __s = (cpi->mt_info).pack_bs_sync.pack_bs_tile_order;
  uVar10 = iVar18 * iVar13 & 0xffff;
  memset(__s,0,(ulong)(uVar10 << 4));
  puVar5 = &(cpi->mt_info).pack_bs_sync.pack_bs_tile_order[0].tile_idx;
  lVar3 = 0x5328;
  for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
    ((PackBSTileOrder *)(puVar5 + -4))->abs_sum_level =
         *(uint64_t *)((long)((cpi->tile_data->tctx).txb_skip_cdf + -1) + 0x2e + lVar3);
    *puVar5 = (uint16_t)uVar20;
    puVar5 = puVar5 + 8;
    lVar3 = lVar3 + 0x5d10;
  }
  qsort(__s,(ulong)uVar10,0x10,compare_tile_order);
  launch_workers(&cpi->mt_info,num_workers);
  sync_enc_workers(&cpi->mt_info,&cpi->common,num_workers);
  uVar10 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  local_c838[0] = 0;
  tg_size_mi[0] = 1;
  uVar20 = 0;
  local_d078 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    local_d078 = uVar20;
  }
  piVar6 = &pack_bs_params[0].new_tg;
  lVar22 = 0;
  lVar3 = 0;
  local_d088 = local_d080;
  for (; local_d078 != uVar20; uVar20 = uVar20 + 1) {
    if (*piVar6 != 0) {
      uVar10 = *local_d068;
      local_c838[0] = (size_t)piVar6[-5];
      *tile_data_start = *tile_data_start + local_c838[0];
      local_d088 = local_d080 + uVar10;
      *obu_header_size = piVar6[-6];
    }
    uVar8 = *(ulong *)(piVar6 + -0x11);
    iVar18 = piVar6[-1];
    local_c838[0] = local_c838[0] + uVar8 + (ulong)(iVar18 == 0) * 4;
    if (*max_tile_size < uVar8) {
      *largest_tile_id = (int)uVar20;
      *max_tile_size = (uint)uVar8;
    }
    uVar10 = (uint)uVar8 + **(uint32_t **)(piVar6 + -0xf);
    local_d08c = uVar10;
    if (uVar20 != 0) {
      memmove(local_d080 + lVar22,local_d080 + lVar3,(ulong)uVar10);
    }
    if (iVar18 != 0) {
      av1_write_last_tile_info
                (cpi,local_d050,((PackBSParams *)(piVar6 + -0x15))->saved_wb,local_c838,local_d088,
                 &local_d08c,tile_data_start,largest_tile_id,tg_size_mi,*obu_header_size,
                 *(uint8_t *)(piVar6 + -7));
      uVar10 = local_d08c;
    }
    lVar3 = lVar3 + *(size_t *)(piVar6 + -9);
    *local_d068 = *local_d068 + uVar10;
    lVar22 = lVar22 + (ulong)uVar10;
    piVar6 = piVar6 + 0x16;
  }
  lVar3 = (ulong)(uint)num_workers * 0x1d0 + -0x1c8;
  for (; 0 < num_workers; num_workers = num_workers + -1) {
    av1_accumulate_pack_bs_thread_data
              (cpi,*(ThreadData_conflict **)
                    ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar3 + -0x20));
    lVar3 = lVar3 + -0x1d0;
  }
  return;
}

Assistant:

void av1_write_tile_obu_mt(
    AV1_COMP *const cpi, uint8_t *const dst, uint32_t *total_size,
    struct aom_write_bit_buffer *saved_wb, uint8_t obu_extn_header,
    const FrameHeaderInfo *fh_info, int *const largest_tile_id,
    unsigned int *max_tile_size, uint32_t *const obu_header_size,
    uint8_t **tile_data_start, const int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;

  PackBSParams pack_bs_params[MAX_TILES];
  uint32_t tile_size[MAX_TILES] = { 0 };

  for (int tile_idx = 0; tile_idx < MAX_TILES; tile_idx++)
    pack_bs_params[tile_idx].total_size = &tile_size[tile_idx];

  init_tile_pack_bs_params(cpi, dst, saved_wb, pack_bs_params, obu_extn_header);
  prepare_pack_bs_workers(cpi, pack_bs_params, pack_bs_worker_hook,
                          num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, &cpi->common, num_workers);
  accumulate_pack_bs_data(cpi, pack_bs_params, dst, total_size, fh_info,
                          largest_tile_id, max_tile_size, obu_header_size,
                          tile_data_start, num_workers);
}